

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fTextureUnitTests.cpp
# Opt level: O1

void __thiscall
deqp::gles2::Functional::MultiTexShader::shadeFragments
          (MultiTexShader *this,FragmentPacket *packets,int numPackets,
          FragmentShadingContext *context)

{
  int iVar1;
  pointer pMVar2;
  GenericVec4 *pGVar3;
  FragmentShadingContext *context_00;
  int i;
  FragmentPacket *packet;
  long lVar4;
  long lVar5;
  float *pfVar6;
  undefined8 *puVar7;
  Vec4 *pVVar8;
  int iVar9;
  float *pfVar10;
  long lVar11;
  long lVar12;
  float v;
  float fVar13;
  Vec2 transformedTexCoords [4];
  Vec2 texCoords [4];
  Vector<float,_3> res_1;
  Vector<float,_3> res;
  Vector<float,_3> res_3;
  Vector<float,_3> res_2;
  Vec4 outColors [4];
  Vec4 texSamples [4];
  rr *local_1f8;
  undefined8 local_1f0;
  rr *local_1e8;
  undefined8 local_1e0;
  Vec3 local_1d8;
  float afStack_1cc [9];
  rr *local_1a8;
  rr *local_1a0;
  float *local_198;
  rr *local_190;
  ulong local_188;
  float *local_180;
  undefined8 local_178;
  rr *local_170;
  int local_168 [3];
  float local_15c;
  undefined8 local_158;
  undefined4 local_150;
  undefined8 local_148;
  undefined4 local_140;
  undefined8 local_138;
  undefined4 local_130;
  float local_128 [4];
  FragmentShadingContext *local_118;
  long local_110;
  rr *local_108;
  undefined8 local_100;
  FragmentPacket *local_f8;
  ulong local_f0;
  ulong local_e8;
  rr *local_dc;
  undefined4 local_d4;
  float *local_d0;
  undefined4 local_c8;
  undefined8 local_c4;
  deUint32 local_bc;
  undefined8 local_b8;
  deUint32 adStack_b0 [14];
  Vec4 local_78;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  local_118 = context;
  local_f8 = packets;
  if (0 < numPackets) {
    local_f0 = (ulong)(uint)numPackets;
    local_e8 = 0;
    local_188 = 0;
    do {
      local_b8 = 0;
      adStack_b0[0] = 0;
      adStack_b0[1] = 0;
      adStack_b0[2] = 0;
      adStack_b0[3] = 0;
      adStack_b0[4] = 0;
      adStack_b0[5] = 0;
      adStack_b0[6] = 0;
      adStack_b0[7] = 0;
      adStack_b0[8] = 0;
      adStack_b0[9] = 0;
      adStack_b0[10] = 0;
      adStack_b0[0xb] = 0;
      adStack_b0[0xc] = 0;
      adStack_b0[0xd] = 0;
      if (0 < *(int *)&(this->super_ShaderProgram).field_0x154) {
        packet = local_f8 + local_188;
        local_15c = 1.0 / (float)*(int *)&(this->super_ShaderProgram).field_0x154;
        local_110 = 0;
        lVar12 = 0;
        do {
          context_00 = local_118;
          local_48 = 0;
          uStack_40 = 0;
          local_58 = 0;
          uStack_50 = 0;
          local_68 = 0;
          uStack_60 = 0;
          local_78.m_data[0] = 0.0;
          local_78.m_data[1] = 0.0;
          local_78.m_data[2] = 0.0;
          local_78.m_data[3] = 0.0;
          rr::readTriangleVarying<float>((rr *)&local_170,packet,local_118,0,0);
          local_1d8.m_data._0_8_ = (rr *)&local_170;
          local_1d8.m_data[2] = 0.0;
          afStack_1cc[0] = 1.4013e-45;
          local_1a8 = (rr *)0x0;
          lVar4 = 0;
          do {
            *(undefined4 *)((long)&local_1a8 + lVar4 * 4) =
                 *(undefined4 *)((long)&local_170 + (long)(int)local_1d8.m_data[lVar4 + 2] * 4);
            lVar4 = lVar4 + 1;
          } while (lVar4 == 1);
          rr::readTriangleVarying<float>((rr *)&local_180,packet,context_00,0,1);
          local_1e8 = (rr *)&local_180;
          local_1e0 = 0x100000000;
          local_1a0 = (rr *)0x0;
          lVar4 = 2;
          do {
            *(undefined4 *)((long)&local_1a8 + lVar4 * 4) =
                 *(undefined4 *)
                  ((long)&local_180 + (long)*(int *)((long)&local_1e8 + lVar4 * 4) * 4);
            lVar4 = lVar4 + 1;
          } while (lVar4 == 3);
          rr::readTriangleVarying<float>((rr *)&local_148,packet,context_00,0,2);
          local_1f8 = (rr *)&local_148;
          local_1f0 = 0x100000000;
          local_198 = (float *)0x0;
          lVar4 = 2;
          do {
            *(undefined4 *)((long)&local_1a0 + lVar4 * 4) =
                 *(undefined4 *)
                  ((long)&local_148 + (long)*(int *)((long)&local_1f8 + lVar4 * 4) * 4);
            lVar4 = lVar4 + 1;
          } while (lVar4 == 3);
          rr::readTriangleVarying<float>((rr *)&local_158,packet,context_00,0,3);
          lVar4 = local_110;
          local_108 = (rr *)&local_158;
          local_100 = 0x100000000;
          local_190 = (rr *)0x0;
          lVar5 = 2;
          do {
            *(undefined4 *)((long)&local_198 + lVar5 * 4) =
                 *(undefined4 *)
                  ((long)&local_158 + (long)*(int *)((long)&local_108 + lVar5 * 4) * 4);
            lVar5 = lVar5 + 1;
          } while (lVar5 == 3);
          if ((this->m_unitTypes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_start[lVar12] == 0xde1) {
            pMVar2 = (this->m_transformations).
                     super__Vector_base<tcu::Matrix<float,_3,_3>,_std::allocator<tcu::Matrix<float,_3,_3>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            local_108 = local_1a8;
            local_100 = 0x13f800000;
            local_148 = 0;
            local_140 = 0;
            pfVar6 = (float *)((long)(pMVar2->m_data).m_data[0].m_data + local_110);
            lVar5 = 0;
            do {
              fVar13 = 0.0;
              lVar11 = 0;
              pfVar10 = pfVar6;
              do {
                fVar13 = fVar13 + *pfVar10 * *(float *)((long)&local_108 + lVar11 * 4);
                lVar11 = lVar11 + 1;
                pfVar10 = pfVar10 + 3;
              } while (lVar11 != 3);
              *(float *)((long)&local_148 + lVar5 * 4) = fVar13;
              lVar5 = lVar5 + 1;
              pfVar6 = pfVar6 + 1;
            } while (lVar5 != 3);
            local_170 = (rr *)&local_148;
            local_168[0] = 0;
            local_168[1] = 1;
            local_1d8.m_data[0] = 0.0;
            local_1d8.m_data[1] = 0.0;
            lVar5 = 0;
            do {
              local_1d8.m_data[lVar5] = *(float *)((long)&local_148 + (long)local_168[lVar5] * 4);
              lVar5 = lVar5 + 1;
            } while (lVar5 == 1);
            local_c4 = local_1a0;
            local_bc = 0x3f800000;
            local_158 = 0;
            local_150 = 0;
            pfVar6 = (float *)((long)(pMVar2->m_data).m_data[0].m_data + local_110);
            lVar5 = 0;
            do {
              fVar13 = 0.0;
              lVar11 = 0;
              pfVar10 = pfVar6;
              do {
                fVar13 = fVar13 + *pfVar10 * *(float *)((long)&local_c4 + lVar11 * 4);
                lVar11 = lVar11 + 1;
                pfVar10 = pfVar10 + 3;
              } while (lVar11 != 3);
              *(float *)((long)&local_158 + lVar5 * 4) = fVar13;
              lVar5 = lVar5 + 1;
              pfVar6 = pfVar6 + 1;
            } while (lVar5 != 3);
            local_1e8 = (rr *)&local_158;
            local_1e0 = 0x100000000;
            local_1d8.m_data[2] = 0.0;
            afStack_1cc[0] = 0.0;
            lVar5 = 2;
            do {
              local_1d8.m_data[lVar5] =
                   *(float *)((long)&local_158 + (long)*(int *)((long)&local_1e8 + lVar5 * 4) * 4);
              lVar5 = lVar5 + 1;
            } while (lVar5 == 3);
            local_d0 = local_198;
            local_c8 = 0x3f800000;
            local_128[0] = 0.0;
            local_128[1] = 0.0;
            local_128[2] = 0.0;
            pfVar6 = (float *)((long)(pMVar2->m_data).m_data[0].m_data + local_110);
            lVar5 = 0;
            do {
              fVar13 = 0.0;
              lVar11 = 0;
              pfVar10 = pfVar6;
              do {
                fVar13 = fVar13 + *pfVar10 * *(float *)((long)&local_d0 + lVar11 * 4);
                lVar11 = lVar11 + 1;
                pfVar10 = pfVar10 + 3;
              } while (lVar11 != 3);
              local_128[lVar5] = fVar13;
              lVar5 = lVar5 + 1;
              pfVar6 = pfVar6 + 1;
            } while (lVar5 != 3);
            local_180 = local_128;
            local_178 = 0x100000000;
            afStack_1cc[1] = 0.0;
            afStack_1cc[2] = 0.0;
            lVar5 = 2;
            do {
              local_1d8.m_data[lVar5 + 2] = local_128[*(int *)((long)&local_180 + lVar5 * 4)];
              lVar5 = lVar5 + 1;
            } while (lVar5 == 3);
            local_dc = local_190;
            local_d4 = 0x3f800000;
            local_138 = 0;
            local_130 = 0;
            pfVar6 = (float *)((long)(pMVar2->m_data).m_data[0].m_data + local_110);
            lVar5 = 0;
            do {
              fVar13 = 0.0;
              lVar11 = 0;
              pfVar10 = pfVar6;
              do {
                fVar13 = fVar13 + *pfVar10 * *(float *)((long)&local_dc + lVar11 * 4);
                lVar11 = lVar11 + 1;
                pfVar10 = pfVar10 + 3;
              } while (lVar11 != 3);
              *(float *)((long)&local_138 + lVar5 * 4) = fVar13;
              lVar5 = lVar5 + 1;
              pfVar6 = pfVar6 + 1;
            } while (lVar5 != 3);
            local_1f8 = (rr *)&local_138;
            local_1f0 = 0x100000000;
            afStack_1cc[3] = 0.0;
            afStack_1cc[4] = 0.0;
            lVar5 = 2;
            do {
              afStack_1cc[lVar5 + 1] =
                   *(float *)((long)&local_138 + (long)*(int *)((long)&local_1f8 + lVar5 * 4) * 4);
              lVar5 = lVar5 + 1;
            } while (lVar5 == 3);
            sglr::rc::Texture2D::sample4
                      ((this->super_ShaderProgram).m_uniforms.
                       super__Vector_base<sglr::UniformSlot,_std::allocator<sglr::UniformSlot>_>.
                       _M_impl.super__Vector_impl_data._M_start[(int)lVar12 * 2].sampler.tex2D,
                       &local_78,(Vec2 *)&local_1d8,0.0);
          }
          else {
            pMVar2 = (this->m_transformations).
                     super__Vector_base<tcu::Matrix<float,_3,_3>,_std::allocator<tcu::Matrix<float,_3,_3>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            local_170 = local_1a8;
            local_168[0] = 0x3f800000;
            local_1d8.m_data[0] = 0.0;
            local_1d8.m_data[1] = 0.0;
            local_1d8.m_data[2] = 0.0;
            pfVar6 = (float *)((long)(pMVar2->m_data).m_data[0].m_data + local_110);
            lVar5 = 0;
            do {
              fVar13 = 0.0;
              lVar11 = 0;
              pfVar10 = pfVar6;
              do {
                fVar13 = fVar13 + *pfVar10 * *(float *)((long)&local_170 + lVar11 * 4);
                lVar11 = lVar11 + 1;
                pfVar10 = pfVar10 + 3;
              } while (lVar11 != 3);
              local_1d8.m_data[lVar5] = fVar13;
              lVar5 = lVar5 + 1;
              pfVar6 = pfVar6 + 1;
            } while (lVar5 != 3);
            local_1e8 = local_1a0;
            local_1e0 = CONCAT44(local_1e0._4_4_,0x3f800000);
            afStack_1cc[2] = 0.0;
            afStack_1cc[0] = 0.0;
            afStack_1cc[1] = 0.0;
            pfVar6 = (float *)((long)(pMVar2->m_data).m_data[0].m_data + local_110);
            lVar5 = 0;
            do {
              fVar13 = 0.0;
              lVar11 = 0;
              pfVar10 = pfVar6;
              do {
                fVar13 = fVar13 + *pfVar10 * *(float *)((long)&local_1e8 + lVar11 * 4);
                lVar11 = lVar11 + 1;
                pfVar10 = pfVar10 + 3;
              } while (lVar11 != 3);
              afStack_1cc[lVar5] = fVar13;
              lVar5 = lVar5 + 1;
              pfVar6 = pfVar6 + 1;
            } while (lVar5 != 3);
            local_180 = local_198;
            local_178 = CONCAT44(local_178._4_4_,0x3f800000);
            afStack_1cc[5] = 0.0;
            afStack_1cc[3] = 0.0;
            afStack_1cc[4] = 0.0;
            pfVar6 = (float *)((long)(pMVar2->m_data).m_data[0].m_data + local_110);
            lVar5 = 0;
            do {
              fVar13 = 0.0;
              lVar11 = 0;
              pfVar10 = pfVar6;
              do {
                fVar13 = fVar13 + *pfVar10 * *(float *)((long)&local_180 + lVar11 * 4);
                lVar11 = lVar11 + 1;
                pfVar10 = pfVar10 + 3;
              } while (lVar11 != 3);
              afStack_1cc[lVar5 + 3] = fVar13;
              lVar5 = lVar5 + 1;
              pfVar6 = pfVar6 + 1;
            } while (lVar5 != 3);
            local_1f8 = local_190;
            local_1f0 = CONCAT44(local_1f0._4_4_,0x3f800000);
            afStack_1cc[8] = 0.0;
            afStack_1cc[6] = 0.0;
            afStack_1cc[7] = 0.0;
            pfVar6 = (float *)((long)(pMVar2->m_data).m_data[0].m_data + local_110);
            lVar5 = 0;
            do {
              fVar13 = 0.0;
              lVar11 = 0;
              pfVar10 = pfVar6;
              do {
                fVar13 = fVar13 + *pfVar10 * *(float *)((long)&local_1f8 + lVar11 * 4);
                lVar11 = lVar11 + 1;
                pfVar10 = pfVar10 + 3;
              } while (lVar11 != 3);
              afStack_1cc[lVar5 + 6] = fVar13;
              lVar5 = lVar5 + 1;
              pfVar6 = pfVar6 + 1;
            } while (lVar5 != 3);
            sglr::rc::TextureCube::sample4
                      ((this->super_ShaderProgram).m_uniforms.
                       super__Vector_base<sglr::UniformSlot,_std::allocator<sglr::UniformSlot>_>.
                       _M_impl.super__Vector_impl_data._M_start[(int)lVar12 * 2].sampler.texCube,
                       &local_78,&local_1d8,0.0);
          }
          puVar7 = &local_b8;
          lVar5 = 0;
          pVVar8 = &local_78;
          do {
            local_1d8.m_data[0] = 0.0;
            local_1d8.m_data[1] = 0.0;
            local_1d8.m_data[2] = 0.0;
            afStack_1cc[0] = 0.0;
            lVar11 = 0;
            do {
              local_1d8.m_data[lVar11] = pVVar8->m_data[lVar11] * local_15c;
              lVar11 = lVar11 + 1;
            } while (lVar11 != 4);
            lVar11 = 0;
            do {
              *(float *)((long)puVar7 + lVar11 * 4) =
                   local_1d8.m_data[lVar11] + *(float *)((long)puVar7 + lVar11 * 4);
              lVar11 = lVar11 + 1;
            } while (lVar11 != 4);
            lVar5 = lVar5 + 1;
            pVVar8 = pVVar8 + 1;
            puVar7 = puVar7 + 2;
          } while (lVar5 != 4);
          lVar12 = lVar12 + 1;
          local_110 = lVar4 + 0x24;
        } while (lVar12 < *(int *)&(this->super_ShaderProgram).field_0x154);
      }
      pGVar3 = local_118->outputArray;
      iVar1 = local_118->numFragmentOutputs;
      iVar9 = iVar1 * (int)local_e8;
      lVar12 = 0xc;
      do {
        pGVar3[iVar9].v.uData[0] = *(deUint32 *)((long)&local_c4 + lVar12);
        pGVar3[iVar9].v.uData[1] = *(deUint32 *)((long)&local_c4 + lVar12 + 4);
        pGVar3[iVar9].v.uData[2] = *(deUint32 *)((long)&local_bc + lVar12);
        pGVar3[iVar9].v.uData[3] = *(deUint32 *)((long)&local_b8 + lVar12);
        lVar12 = lVar12 + 0x10;
        iVar9 = iVar9 + iVar1;
      } while (lVar12 != 0x4c);
      local_188 = local_188 + 1;
      local_e8 = (ulong)((int)local_e8 + 4);
    } while (local_188 != local_f0);
  }
  return;
}

Assistant:

void MultiTexShader::shadeFragments	(rr::FragmentPacket* packets, const int numPackets, const rr::FragmentShadingContext& context) const
{
	DE_ASSERT((int)m_unitTypes.size() == m_numUnits);
	DE_ASSERT((int)m_transformations.size() == m_numUnits);
	DE_ASSERT((int)m_lodDerivateParts.size() == m_numUnits);

	for (int packetNdx = 0; packetNdx < numPackets; ++packetNdx)
	{
		rr::FragmentPacket& packet				= packets[packetNdx];
		const float			colorMultiplier		= 1.0f / (float)m_numUnits;
		Vec4				outColors[4]		= { Vec4(0.0f), Vec4(0.0f), Vec4(0.0f), Vec4(0.0f) };

		for (int unitNdx = 0; unitNdx < m_numUnits; unitNdx++)
		{
			tcu::Vec4 texSamples[4];

			// Read tex coords
			const tcu::Vec2 texCoords[4] =
			{
				rr::readTriangleVarying<float>(packet, context, 0, 0).xy(),
				rr::readTriangleVarying<float>(packet, context, 0, 1).xy(),
				rr::readTriangleVarying<float>(packet, context, 0, 2).xy(),
				rr::readTriangleVarying<float>(packet, context, 0, 3).xy(),
			};

			if (m_unitTypes[unitNdx] == GL_TEXTURE_2D)
			{
				// Transform
				const tcu::Vec2 transformedTexCoords[4] =
				{
					(m_transformations[unitNdx] * Vec3(texCoords[0].x(), texCoords[0].y(), 1.0f)).xy(),
					(m_transformations[unitNdx] * Vec3(texCoords[1].x(), texCoords[1].y(), 1.0f)).xy(),
					(m_transformations[unitNdx] * Vec3(texCoords[2].x(), texCoords[2].y(), 1.0f)).xy(),
					(m_transformations[unitNdx] * Vec3(texCoords[3].x(), texCoords[3].y(), 1.0f)).xy(),
				};

				// Sample
				m_uniforms[2*unitNdx].sampler.tex2D->sample4(texSamples, transformedTexCoords);
			}
			else
			{
				DE_ASSERT(m_unitTypes[unitNdx] == GL_TEXTURE_CUBE_MAP);

				// Transform
				const tcu::Vec3 transformedTexCoords[4] =
				{
					m_transformations[unitNdx] * Vec3(texCoords[0].x(), texCoords[0].y(), 1.0f),
					m_transformations[unitNdx] * Vec3(texCoords[1].x(), texCoords[1].y(), 1.0f),
					m_transformations[unitNdx] * Vec3(texCoords[2].x(), texCoords[2].y(), 1.0f),
					m_transformations[unitNdx] * Vec3(texCoords[3].x(), texCoords[3].y(), 1.0f),
				};

				// Sample
				m_uniforms[2*unitNdx].sampler.texCube->sample4(texSamples, transformedTexCoords);
			}

			// Add to sum
			for (int fragNdx = 0; fragNdx < 4; ++fragNdx)
				outColors[fragNdx] += colorMultiplier * texSamples[fragNdx];
		}

		// output
		for (int fragNdx = 0; fragNdx < 4; ++fragNdx)
			rr::writeFragmentOutput(context, packetNdx, fragNdx, 0, outColors[fragNdx]);
	}
}